

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusStationary.cpp
# Opt level: O1

void __thiscall PerseusStationary::SetValueFunction(PerseusStationary *this,string *filename)

{
  _func_int *p_Var1;
  long lVar2;
  size_t nrA;
  size_t nrS;
  PlanningUnitMADPDiscrete *this_00;
  ValueFunctionPOMDPDiscrete local_68;
  vector<AlphaVector,_std::allocator<AlphaVector>_> local_48;
  
  AlphaVectorPlanning::ImportValueFunction(&local_68,filename);
  local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)&(this->super_Perseus).field_0x90;
  local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_finish = *(pointer *)&(this->super_Perseus).field_0x98;
  local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)&(this->super_Perseus).field_0xa0;
  *(pointer *)&(this->super_Perseus).field_0x90 =
       local_68.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)&(this->super_Perseus).field_0x98 =
       local_68.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)&(this->super_Perseus).field_0xa0 =
       local_68.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_48);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_68);
  p_Var1 = (this->super_Perseus)._vptr_Perseus[-3];
  lVar2 = *(long *)((long)&(this->super_Perseus)._m_verbose + (long)p_Var1);
  if (lVar2 == 0) {
    lVar2 = *(long *)((long)&(this->super_Perseus)._m_bestValue + (long)p_Var1);
  }
  nrA = (**(code **)(**(long **)(lVar2 + 0x30) + 0x68))();
  p_Var1 = (this->super_Perseus)._vptr_Perseus[-3];
  this_00 = *(PlanningUnitMADPDiscrete **)((long)&(this->super_Perseus)._m_verbose + (long)p_Var1);
  if (this_00 == (PlanningUnitMADPDiscrete *)0x0) {
    this_00 = *(PlanningUnitMADPDiscrete **)
               ((long)&(this->super_Perseus)._m_bestValue + (long)p_Var1);
  }
  nrS = PlanningUnitMADPDiscrete::GetNrStates(this_00);
  AlphaVectorPlanning::ValueFunctionToQ
            ((QFunctionsDiscrete *)&local_68,
             (ValueFunctionPOMDPDiscrete *)&(this->super_Perseus).field_0x90,nrA,nrS);
  local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)&(this->super_Perseus).field_0xa8;
  local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_finish = *(pointer *)&(this->super_Perseus).field_0xb0;
  local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)&(this->super_Perseus).field_0xb8;
  *(pointer *)&(this->super_Perseus).field_0xa8 =
       local_68.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)&(this->super_Perseus).field_0xb0 =
       local_68.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)&(this->super_Perseus).field_0xb8 =
       local_68.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             *)&local_48);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             *)&local_68);
  return;
}

Assistant:

void PerseusStationary::SetValueFunction(const string &filename)
{
    _m_valueFunction=ImportValueFunction(filename);
    _m_qFunction=AlphaVectorPlanning::
        ValueFunctionToQ(_m_valueFunction,
                         GetPU()->GetNrJointActions(),
                         GetPU()->GetNrStates());
}